

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O0

int stlss_(double *y,int *n,int *np,int *ns,int *isdeg,int *nsjump,int *userw,double *rw,
          double *season,double *work1,double *work2,double *work3,double *work4)

{
  int local_90;
  int local_8c;
  int nright;
  int nleft;
  double xs;
  int local_78;
  int ok;
  int m;
  int k;
  int j;
  int i__;
  int c__1;
  int i__3;
  int i__2;
  int i__1;
  int *nsjump_local;
  int *isdeg_local;
  int *ns_local;
  int *np_local;
  int *n_local;
  double *y_local;
  
  j = 1;
  n_local = (int *)(y + -1);
  if (0 < *np) {
    i__3 = *np;
    _i__2 = nsjump;
    nsjump_local = isdeg;
    isdeg_local = ns;
    ns_local = np;
    np_local = n;
    for (m = 1; m <= i__3; m = m + 1) {
      ok = (*np_local - m) / *ns_local + 1;
      for (k = 1; k <= ok; k = k + 1) {
        work1[(long)k + -1] = *(double *)(n_local + (long)((k + -1) * *ns_local + m) * 2);
      }
      if (*userw != 0) {
        for (k = 1; k <= ok; k = k + 1) {
          work3[(long)k + -1] = rw[(long)((k + -1) * *ns_local + m) + -1];
        }
      }
      c__1 = ok;
      stless_(work1,&ok,isdeg_local,nsjump_local,_i__2,userw,work3,work2 + 1,work4);
      _nright = 0.0;
      local_90 = imin(*isdeg_local,ok);
      stlest_(work1,&ok,isdeg_local,nsjump_local,(double *)&nright,work2,&j,&local_90,work4,userw,
              work3,(int *)((long)&xs + 4));
      if (xs._4_4_ == 0) {
        *work2 = work2[1];
      }
      _nright = (double)(ok + 1);
      c__1 = 1;
      i__ = (ok - *isdeg_local) + 1;
      local_8c = imax(1,i__);
      stlest_(work1,&ok,isdeg_local,nsjump_local,(double *)&nright,work2 + (long)(ok + 2) + -1,
              &local_8c,&ok,work4,userw,work3,(int *)((long)&xs + 4));
      if (xs._4_4_ == 0) {
        work2[(long)(ok + 2) + -1] = work2[(long)(ok + 1) + -1];
      }
      for (local_78 = 1; local_78 <= ok + 2; local_78 = local_78 + 1) {
        season[(long)((local_78 + -1) * *ns_local + m) + -1] = work2[(long)local_78 + -1];
      }
    }
  }
  return 0;
}

Assistant:

int stlss_(double *y, int *n, int *np, int *ns, int *isdeg, int *nsjump, int *userw, double *rw, 
	double *season, double *work1, double *work2, double *work3, double *work4)
{
    /* System generated locals */
    int i__1, i__2, i__3;
	int c__1 = 1;

    /* Local variables */
    int i__, j, k, m;
    int ok;
    double xs;
    int nleft, nright;

/* 	called by stlstp() at the beginning of each (inner) iteration */

/* Arg */
/* Var */
    /* Parameter adjustments */
    --work4;
    --work3;
    --work2;
    --work1;
    --rw;
    --y;
    --season;

    /* Function Body */
    if (*np < 1) {
	return 0;
    }
    i__1 = *np;
    for (j = 1; j <= i__1; ++j) {
	k = (*n - j) / *np + 1;
	i__2 = k;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    work1[i__] = y[(i__ - 1) * *np + j];
/* L10: */
	}
	if (*userw) {
	    i__2 = k;
	    for (i__ = 1; i__ <= i__2; ++i__) {
		work3[i__] = rw[(i__ - 1) * *np + j];
/* L12: */
	    }
	}
	stless_(&work1[1], &k, ns, isdeg, nsjump, userw, &work3[1], &work2[2],
		 &work4[1]);
	xs = 0.;
	nright = imin(*ns,k);
	stlest_(&work1[1], &k, ns, isdeg, &xs, &work2[1], &c__1, &nright, &
		work4[1], userw, &work3[1], &ok);
	if (! ok) {
	    work2[1] = work2[2];
	}
	xs = (double) (k + 1);
/* Computing MAX */
	i__2 = 1, i__3 = k - *ns + 1;
	nleft = imax(i__2,i__3);
	stlest_(&work1[1], &k, ns, isdeg, &xs, &work2[k + 2], &nleft, &k, &
		work4[1], userw, &work3[1], &ok);
	if (! ok) {
	    work2[k + 2] = work2[k + 1];
	}
	i__2 = k + 2;
	for (m = 1; m <= i__2; ++m) {
	    season[(m - 1) * *np + j] = work2[m];
/* L18: */
	}
/* L200: */
    }
    return 0;
}